

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O1

void __thiscall ui::Led::TriggerTimer(Led *this)

{
  pointer pcVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  long *local_270 [2];
  long local_260 [2];
  long *local_250;
  long local_248;
  long local_240 [2];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar1,pcVar1 + (this->file_path_)._M_string_length);
  std::__cxx11::string::append((char *)local_270);
  std::ofstream::ofstream(&local_230,(string *)local_270,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"timer",5);
  uVar4 = _execvp;
  lVar3 = _VTT;
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _execvp;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar1,pcVar1 + (this->file_path_)._M_string_length);
  std::__cxx11::string::append((char *)local_270);
  std::ofstream::ofstream(&local_230,(string *)local_270,_S_out);
  uVar9 = (uint)((float)this->period_ * this->ratio_);
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar7 = (ulong)uVar2;
    uVar5 = 4;
    do {
      uVar8 = uVar5;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00129800;
      }
      if (uVar6 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00129800;
      }
      if (uVar6 < 10000) goto LAB_00129800;
      uVar7 = uVar7 / 10000;
      uVar5 = uVar8 + 4;
    } while (99999 < uVar6);
    uVar8 = uVar8 + 1;
  }
LAB_00129800:
  local_250 = local_240;
  std::__cxx11::string::_M_construct((ulong)&local_250,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_250 + (ulong)(uVar9 >> 0x1f)),uVar8,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(char *)local_250,local_248);
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  local_230 = lVar3;
  *(undefined8 *)(local_228 + *(long *)(lVar3 + -0x18) + -8) = uVar4;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar1,pcVar1 + (this->file_path_)._M_string_length);
  std::__cxx11::string::append((char *)local_270);
  std::ofstream::ofstream(&local_230,(string *)local_270,_S_out);
  uVar9 = (uint)((float)this->period_ * (1.0 - this->ratio_));
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar7 = (ulong)uVar2;
    uVar5 = 4;
    do {
      uVar8 = uVar5;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00129959;
      }
      if (uVar6 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00129959;
      }
      if (uVar6 < 10000) goto LAB_00129959;
      uVar7 = uVar7 / 10000;
      uVar5 = uVar8 + 4;
    } while (99999 < uVar6);
    uVar8 = uVar8 + 1;
  }
LAB_00129959:
  local_250 = local_240;
  std::__cxx11::string::_M_construct((ulong)&local_250,(char)uVar8 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_250 + (ulong)(uVar9 >> 0x1f)),uVar8,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(char *)local_250,local_248);
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  local_230 = lVar3;
  *(undefined8 *)(local_228 + *(long *)(lVar3 + -0x18) + -8) = uVar4;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  FetchState(this);
  return;
}

Assistant:

void TriggerTimer() {
    std::ofstream(file_path_ + "/trigger") << "timer";
    std::ofstream(file_path_ + "/delay_on")
        << std::to_string(int(ratio_ * period_));
    std::ofstream(file_path_ + "/delay_off")
        << std::to_string(int((1.f - ratio_) * period_));
    FetchState();
  }